

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Type __thiscall
wabt::anon_unknown_4::Validator::GetDeclarationType(Validator *this,FuncDeclaration *decl)

{
  bool bVar1;
  Index code;
  char *pcVar2;
  size_type sVar3;
  const_reference pvVar4;
  int in_EDX;
  FuncDeclaration *decl_local;
  Validator *this_local;
  
  if ((decl->has_func_type & 1U) != 0) {
    pcVar2 = Var::index(&decl->type_var,&decl->has_func_type,in_EDX);
    Type::Type((Type *)((long)&this_local + 4),(int32_t)pcVar2);
    return (Type)this_local._4_4_;
  }
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty(&(decl->sig).param_types);
  if (bVar1) {
    bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty(&(decl->sig).result_types);
    if (bVar1) {
      Type::Type((Type *)((long)&this_local + 4),Void);
      return (Type)this_local._4_4_;
    }
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&(decl->sig).result_types);
    if (sVar3 == 1) {
      pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (&(decl->sig).result_types,0);
      return (Type)pvVar4->enum_;
    }
  }
  code = Module::GetFuncTypeIndex(this->current_module_,decl);
  Type::Type((Type *)((long)&this_local + 4),code);
  return (Type)this_local._4_4_;
}

Assistant:

Type Validator::GetDeclarationType(const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    return Type(decl.type_var.index());
  }
  if (decl.sig.param_types.empty()) {
    if (decl.sig.result_types.empty()) {
      return Type::Void;
    }
    if (decl.sig.result_types.size() == 1) {
      return decl.sig.result_types[0];
    }
  }
  return Type(current_module_->GetFuncTypeIndex(decl));
}